

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMessageClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  bool bVar2;
  FileDescriptor *file;
  ulong uVar3;
  bool must_be_present;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  file = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasFieldPresence(file);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "GOOGLE_DCHECK(!$name$_.IsDefault($default_variable$));\n");
  }
  bVar2 = SupportsArenas(this->descriptor_);
  if (bVar2) {
    FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    }
  }
  else if (bVar1) {
    FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      io::Printer::Print(printer,&this->variables_,
                         "(*$name$_.UnsafeRawStringPointer())->assign(*$default_variable$);\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,"(*$name$_.UnsafeRawStringPointer())->clear();\n"
                        );
    }
  }
  else {
    FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    }
  }
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMessageClearingCode(io::Printer* printer) const {
  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have field presence, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against default_variable.
  const bool must_be_present = HasFieldPresence(descriptor_->file());

  if (must_be_present) {
    printer->Print(variables_,
      "GOOGLE_DCHECK(!$name$_.IsDefault($default_variable$));\n");
  }

  if (SupportsArenas(descriptor_)) {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
  } else if (must_be_present) {
    // When Arenas are disabled and field presence has been checked, we can
    // safely treat the ArenaStringPtr as a string*.
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "(*$name$_.UnsafeRawStringPointer())->clear();\n");
    } else {
      printer->Print(variables_,
        "(*$name$_.UnsafeRawStringPointer())->assign(*$default_variable$);\n");
    }
  } else {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
  }
}